

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O1

WJTL_STATUS TestComments(void)

{
  JL_STATUS JVar1;
  JL_STATUS JVar2;
  JL_STATUS JVar3;
  JL_STATUS JVar4;
  JL_STATUS JVar5;
  int iVar6;
  JL_STATUS JVar7;
  WJTL_STATUS WVar8;
  bool bVar9;
  bool bVar10;
  bool Condition;
  JlDataObject *objectTree;
  uint64_t u64;
  size_t errorAtPos;
  JlDataObject *object;
  char *stringPtr;
  JlDataObject *local_60;
  uint64_t local_58;
  size_t local_50;
  JlDataObject *local_48;
  uint local_3c;
  char *local_38;
  
  local_60 = (JlDataObject *)0x0;
  local_48 = (JlDataObject *)0x0;
  local_50 = 100;
  local_38 = (char *)0x0;
  JVar1 = JlParseJsonEx("// Comment\n1234// Comment\n//Comment",true,&local_60,&local_50);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( \"// Comment\\n1234// Comment\\n//Comment\", 1, &objectTree, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x52b);
  bVar9 = local_60 != (JlDataObject *)0x0;
  WjTestLib_Assert(bVar9,"(objectTree) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x52c);
  JVar2 = JlGetObjectNumberU64(local_60,&local_58);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectNumberU64( objectTree, &u64 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x52d);
  bVar10 = local_58 == 0x4d2;
  WjTestLib_Assert(bVar10,"1234 == u64",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x52e);
  JVar3 = JlFreeObjectTree(&local_60);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x52f);
  JVar4 = JlParseJsonEx("// Comment\n\"abcd\"// Comment\n//Comment",true,&local_60,&local_50);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( \"// Comment\\n\\\"abcd\\\"// Comment\\n//Comment\", 1, &objectTree, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x531);
  Condition = local_60 != (JlDataObject *)0x0;
  WjTestLib_Assert(Condition,"(objectTree) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x532);
  JVar5 = JlGetObjectString(local_60,&local_38);
  WVar8 = WJTL_STATUS_SUCCESS;
  if (!Condition ||
      ((!bVar10 || !bVar9) ||
      (((JVar1 != JL_STATUS_SUCCESS || JVar3 != JL_STATUS_SUCCESS) || JVar2 != JL_STATUS_SUCCESS) ||
      JVar4 != JL_STATUS_SUCCESS))) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (JVar5 != JL_STATUS_SUCCESS) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectString( objectTree, &stringPtr ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x533);
  iVar6 = strcmp(local_38,"abcd");
  WjTestLib_Assert(iVar6 == 0,"strcmp( stringPtr, \"abcd\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x534);
  JVar1 = JlFreeObjectTree(&local_60);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x535);
  JVar2 = JlParseJsonEx("/* Comment*/\n/*Comment*/5678/*Comment*/",true,&local_60,&local_50);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( \"/* Comment*/\\n/*Comment*/5678/*Comment*/\", 1, &objectTree, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x537);
  bVar9 = local_60 != (JlDataObject *)0x0;
  WjTestLib_Assert(bVar9,"(objectTree) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x538);
  JVar3 = JlGetObjectNumberU64(local_60,&local_58);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectNumberU64( objectTree, &u64 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x539);
  bVar10 = local_58 == 0x162e;
  WjTestLib_Assert(bVar10,"5678 == u64",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x53a);
  JVar4 = JlFreeObjectTree(&local_60);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x53b);
  JVar5 = JlParseJsonEx("{\n  \"a\" : /* */ 1,\n //\"b\" : 2,\n /*       \n   //     */\n  //   /* junk\n /* */ \"c\"/*  *//**/ /*  */:/* */ 3/* */\n}\n"
                        ,true,&local_60,&local_50);
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( \"{\\n\" \"  \\\"a\\\" : /* */ 1,\\n\" \" //\\\"b\\\" : 2,\\n\" \" /*       \\n\" \"   //     */\\n\" \"  //   /* junk\\n\" \" /* */ \\\"c\\\"/*  *//**/ /*  */:/* */ 3/* */\\n\" \"}\\n\", 1, &objectTree, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x547);
  local_3c = (uint)((bVar10 && bVar9) &&
                   (((JVar3 == JL_STATUS_SUCCESS && JVar4 == JL_STATUS_SUCCESS) &&
                    ((JVar1 == JL_STATUS_SUCCESS && JVar2 == JL_STATUS_SUCCESS) && iVar6 == 0)) &&
                   JVar5 == JL_STATUS_SUCCESS));
  bVar9 = local_60 != (JlDataObject *)0x0;
  WjTestLib_Assert(bVar9,"(objectTree) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x548);
  JVar1 = JlGetObjectFromDictionaryByKey(local_60,"a",&local_48);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectFromDictionaryByKey( objectTree, \"a\", &object ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54a);
  JVar2 = JlGetObjectNumberU64(local_48,&local_58);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54b);
  bVar10 = local_58 == 1;
  WjTestLib_Assert(bVar10,"1 == u64",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54c);
  JVar3 = JlGetObjectFromDictionaryByKey(local_60,"b",&local_48);
  WjTestLib_Assert(JVar3 == JL_STATUS_NOT_FOUND,
                   "(JlGetObjectFromDictionaryByKey( objectTree, \"b\", &object )) == (JL_STATUS_NOT_FOUND)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54d);
  JVar4 = JlGetObjectFromDictionaryByKey(local_60,"c",&local_48);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectFromDictionaryByKey( objectTree, \"c\", &object ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54e);
  JVar5 = JlGetObjectNumberU64(local_48,&local_58);
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54f);
  WjTestLib_Assert(local_58 == 3,"3 == u64",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x550);
  JVar7 = JlFreeObjectTree(&local_60);
  if ((local_3c & 1) == 0) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (local_58 != 3 ||
      ((JVar3 != JL_STATUS_NOT_FOUND || (!bVar10 || !bVar9)) ||
      (((JVar2 != JL_STATUS_SUCCESS || JVar1 != JL_STATUS_SUCCESS) || JVar4 != JL_STATUS_SUCCESS) ||
      JVar5 != JL_STATUS_SUCCESS))) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (JVar7 != JL_STATUS_SUCCESS) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x552);
  return WVar8;
}

Assistant:

static
WJTL_STATUS
    TestComments
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    JlDataObject* objectTree = NULL;
    JlDataObject* object = NULL;
    size_t errorAtPos = 100;
    uint64_t u64;
    char const* stringPtr = NULL;

    JL_ASSERT_SUCCESS( JlParseJsonEx( "// Comment\n1234// Comment\n//Comment", true, &objectTree, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( objectTree );
    JL_ASSERT_SUCCESS( JlGetObjectNumberU64( objectTree, &u64 ) );
    JL_ASSERT( 1234 == u64 );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );

    JL_ASSERT_SUCCESS( JlParseJsonEx( "// Comment\n\"abcd\"// Comment\n//Comment", true, &objectTree, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( objectTree );
    JL_ASSERT_SUCCESS( JlGetObjectString( objectTree, &stringPtr ) );
    JL_ASSERT( strcmp( stringPtr, "abcd" ) == 0 );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );

    JL_ASSERT_SUCCESS( JlParseJsonEx( "/* Comment*/\n/*Comment*/5678/*Comment*/", true, &objectTree, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( objectTree );
    JL_ASSERT_SUCCESS( JlGetObjectNumberU64( objectTree, &u64 ) );
    JL_ASSERT( 5678 == u64 );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );

    // complicated example
    JL_ASSERT_SUCCESS( JlParseJsonEx(
        "{\n"
        "  \"a\" : /* */ 1,\n"
        " //\"b\" : 2,\n"
        " /*       \n"
        "   //     */\n"
        "  //   /* junk\n"
        " /* */ \"c\"/*  *//**/ /*  */:/* */ 3/* */\n"
        "}\n",
        true, &objectTree, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( objectTree );

    JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( objectTree, "a", &object ) );
    JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
    JL_ASSERT( 1 == u64 );
    JL_ASSERT_STATUS( JlGetObjectFromDictionaryByKey( objectTree, "b", &object ), JL_STATUS_NOT_FOUND );
    JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( objectTree, "c", &object ) );
    JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
    JL_ASSERT( 3 == u64 );

    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );

    return TestReturn;
}